

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O3

void __thiscall
ObjectInfoCollection::RemoveObject
          (ObjectInfoCollection *this,uint64_t object_handle,XrObjectType object_type)

{
  pointer pXVar1;
  pointer pXVar2;
  pointer pXVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  iterator __first;
  
  pXVar2 = (this->object_info_).
           super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pXVar1 = (this->object_info_).
           super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)pXVar1 - (long)pXVar2;
  lVar5 = (lVar4 >> 4) * -0x5555555555555555 >> 2;
  pXVar3 = pXVar2;
  lVar6 = lVar4;
  if (0 < lVar5) {
    pXVar3 = pXVar2 + lVar5 * 4;
    lVar5 = lVar5 + 1;
    __first._M_current = pXVar2 + 2;
    do {
      if ((__first._M_current[-2].handle == object_handle) &&
         (__first._M_current[-2].type == object_type)) {
        __first._M_current = __first._M_current + -2;
        goto LAB_0010865d;
      }
      if ((__first._M_current[-1].handle == object_handle) &&
         (__first._M_current[-1].type == object_type)) {
        __first._M_current = __first._M_current + -1;
        goto LAB_0010865d;
      }
      if (((__first._M_current)->handle == object_handle) &&
         ((__first._M_current)->type == object_type)) goto LAB_0010865d;
      if ((__first._M_current[1].handle == object_handle) &&
         (__first._M_current[1].type == object_type)) {
        __first._M_current = __first._M_current + 1;
        goto LAB_0010865d;
      }
      lVar5 = lVar5 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar5);
    lVar6 = (long)pXVar1 - (long)pXVar3;
  }
  lVar6 = (lVar6 >> 4) * -0x5555555555555555;
  if (lVar6 == 1) {
LAB_0010864c:
    __first._M_current = pXVar1;
    if (pXVar3->type == object_type) {
      __first._M_current = pXVar3;
    }
    if (pXVar3->handle != object_handle) {
      __first._M_current = pXVar1;
    }
  }
  else if (lVar6 == 2) {
LAB_00108627:
    if ((pXVar3->handle != object_handle) ||
       (__first._M_current = pXVar3, pXVar3->type != object_type)) {
      pXVar3 = pXVar3 + 1;
      goto LAB_0010864c;
    }
  }
  else {
    __first._M_current = pXVar1;
    if (lVar6 != 3) goto LAB_001086b8;
    if ((pXVar3->handle != object_handle) ||
       (__first._M_current = pXVar3, pXVar3->type != object_type)) {
      pXVar3 = pXVar3 + 1;
      goto LAB_00108627;
    }
  }
LAB_0010865d:
  pXVar3 = __first._M_current + 1;
  if (pXVar3 != pXVar1 && __first._M_current != pXVar1) {
    do {
      if ((pXVar3->handle != object_handle) || (pXVar3->type != object_type)) {
        (__first._M_current)->type = pXVar3->type;
        (__first._M_current)->handle = pXVar3->handle;
        std::__cxx11::string::operator=
                  ((string *)&(__first._M_current)->name,(string *)&pXVar3->name);
        __first._M_current = __first._M_current + 1;
      }
      pXVar3 = pXVar3 + 1;
    } while (pXVar3 != pXVar1);
    pXVar2 = (this->object_info_).
             super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)pXVar1 - (long)pXVar2;
  }
LAB_001086b8:
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::_M_erase
            (&this->object_info_,__first,(XrSdkLogObjectInfo *)((long)&pXVar2->handle + lVar4));
  return;
}

Assistant:

void ObjectInfoCollection::RemoveObject(uint64_t object_handle, XrObjectType object_type) {
    vector_remove_if_and_erase(
        object_info_, [=](XrSdkLogObjectInfo const& info) { return info.handle == object_handle && info.type == object_type; });
}